

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack12_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0xfff) + base;
  out[1] = (*in >> 0xc & 0xfff) + base;
  uVar1 = *in;
  out[2] = uVar1 >> 0x18;
  out[2] = (uVar1 >> 0x18) + base + (in[1] & 0xf) * 0x100;
  out[3] = (in[1] >> 4 & 0xfff) + base;
  out[4] = (*(ushort *)((long)in + 6) & 0xfff) + base;
  uVar1 = in[1];
  out[5] = uVar1 >> 0x1c;
  out[5] = (uVar1 >> 0x1c) + base + (in[2] & 0xff) * 0x10;
  out[6] = (in[2] >> 8 & 0xfff) + base;
  out[7] = (in[2] >> 0x14) + base;
  return in + 3;
}

Assistant:

uint32_t * unpack12_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 12 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 12 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 12 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 12 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 12 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 12 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 12 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}